

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

CallIndirect * __thiscall
wasm::Builder::makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,Name table,Expression *target,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args,HeapType heapType,
          bool isReturn)

{
  int iVar1;
  CallIndirect *pCVar2;
  uintptr_t extraout_RDX;
  MixedArena *this_00;
  HeapType heapType_local;
  
  iVar1 = wasm::HeapType::getKind();
  if (iVar1 == 1) {
    this_00 = &this->wasm->allocator;
    pCVar2 = (CallIndirect *)MixedArena::allocSpace(this_00,0x58,8);
    (pCVar2->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression._id =
         CallIndirectId;
    (pCVar2->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id = 0;
    (pCVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    data = (Expression **)0x0;
    (pCVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    (pCVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    (pCVar2->operands).allocator = this_00;
    pCVar2->isReturn = false;
    (pCVar2->table).super_IString.str._M_len = table.super_IString.str._M_len;
    (pCVar2->table).super_IString.str._M_str = table.super_IString.str._M_str;
    (pCVar2->heapType).id = heapType.id;
    wasm::HeapType::getSignature();
    (pCVar2->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id =
         extraout_RDX;
    pCVar2->target = target;
    ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
    set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
              ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
               &pCVar2->operands,args);
    pCVar2->isReturn = isReturn;
    wasm::CallIndirect::finalize();
    return pCVar2;
  }
  __assert_fail("heapType.isSignature()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x122,
                "CallIndirect *wasm::Builder::makeCallIndirect(const Name, Expression *, const T &, HeapType, bool) [T = std::vector<wasm::Expression *>]"
               );
}

Assistant:

CallIndirect* makeCallIndirect(const Name table,
                                 Expression* target,
                                 const T& args,
                                 HeapType heapType,
                                 bool isReturn = false) {
    assert(heapType.isSignature());
    auto* call = wasm.allocator.alloc<CallIndirect>();
    call->table = table;
    call->heapType = heapType;
    call->type = heapType.getSignature().results;
    call->target = target;
    call->operands.set(args);
    call->isReturn = isReturn;
    call->finalize();
    return call;
  }